

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DiscreteQuantileListFunction::Deserialize
          (DiscreteQuantileListFunction *this,Deserializer *deserializer,AggregateFunction *function
          )

{
  reference type;
  AggregateFunction local_140;
  
  QuantileBindData::Deserialize((Deserializer *)this,(AggregateFunction *)deserializer);
  type = vector<duckdb::LogicalType,_true>::get<true>
                   (&(function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  GetAggregate(&local_140,type);
  AggregateFunction::operator=(function,&local_140);
  AggregateFunction::~AggregateFunction(&local_140);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, AggregateFunction &function) {
		auto bind_data = QuantileBindData::Deserialize(deserializer, function);

		auto &input_type = function.arguments[0];
		function = GetAggregate(input_type);
		return bind_data;
	}